

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void float64_suite::fail_missing_four(void)

{
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [5];
  
  decoder.current.view._M_str._3_4_ = 0xd7;
  decoder.current.view._M_str._7_1_ = 0;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[5]>
            ((decoder *)local_38,(uchar (*) [5])((long)&decoder.current.view._M_str + 3));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x39b,"void float64_suite::fail_missing_four()",local_40,&local_44);
  return;
}

Assistant:

void fail_missing_four()
{
    const value_type input[] = { token::code::float64, 0x00, 0x00, 0x00, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}